

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int UTF8Toisolat1(uchar *out,int *outlen,uchar *in,int *inlen)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uchar *processed;
  int iVar4;
  byte *pbVar5;
  uchar *puVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  
  iVar4 = (int)out;
  iVar3 = (int)in;
  if (inlen == (int *)0x0 || (outlen == (int *)0x0 || out == (uchar *)0x0)) {
    return -1;
  }
  if (in == (uchar *)0x0) {
    *outlen = 0;
    *inlen = 0;
    return 0;
  }
  pbVar5 = in + *inlen;
  puVar6 = out + *outlen;
  while( true ) {
    iVar2 = (int)in;
    if (pbVar5 <= in) break;
    bVar1 = *in;
    uVar7 = (uint)bVar1;
    uVar9 = 0;
    if ((char)bVar1 < '\0') {
      if (bVar1 < 0xc0) goto LAB_00141fa5;
      uVar7 = (uint)bVar1;
      if (bVar1 < 0xe0) {
        uVar7 = uVar7 & 0x1f;
        uVar9 = 1;
      }
      else if (bVar1 < 0xf0) {
        uVar7 = uVar7 & 0xf;
        uVar9 = 2;
      }
      else {
        if (0xf7 < bVar1) goto LAB_00141fa5;
        uVar7 = uVar7 & 7;
        uVar9 = 3;
      }
    }
    in = in + 1;
    if ((long)pbVar5 - (long)in < (long)uVar9) break;
    for (; (iVar8 = (int)uVar9, uVar9 = (ulong)(iVar8 - 1), iVar8 != 0 && (in < pbVar5));
        in = in + 1) {
      if ((*in & 0xc0) != 0x80) goto LAB_00141fa5;
      uVar7 = uVar7 << 6 | *in & 0x3f;
    }
    if (0xff < uVar7) {
LAB_00141fa5:
      *outlen = (int)out - iVar4;
      *inlen = iVar2 - iVar3;
      return -2;
    }
    if (puVar6 <= out) break;
    *out = (uchar)uVar7;
    out = out + 1;
  }
  *outlen = (int)out - iVar4;
  *inlen = iVar2 - iVar3;
  return *outlen;
}

Assistant:

int
UTF8Toisolat1(unsigned char* out, int *outlen,
              const unsigned char* in, int *inlen) {
    const unsigned char* processed = in;
    const unsigned char* outend;
    const unsigned char* outstart = out;
    const unsigned char* instart = in;
    const unsigned char* inend;
    unsigned int c, d;
    int trailing;

    if ((out == NULL) || (outlen == NULL) || (inlen == NULL)) return(-1);
    if (in == NULL) {
        /*
	 * initialization nothing to do
	 */
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    inend = in + (*inlen);
    outend = out + (*outlen);
    while (in < inend) {
	d = *in++;
	if      (d < 0x80)  { c= d; trailing= 0; }
	else if (d < 0xC0) {
	    /* trailing byte in leading position */
	    *outlen = out - outstart;
	    *inlen = processed - instart;
	    return(-2);
        } else if (d < 0xE0)  { c= d & 0x1F; trailing= 1; }
        else if (d < 0xF0)  { c= d & 0x0F; trailing= 2; }
        else if (d < 0xF8)  { c= d & 0x07; trailing= 3; }
	else {
	    /* no chance for this in IsoLat1 */
	    *outlen = out - outstart;
	    *inlen = processed - instart;
	    return(-2);
	}

	if (inend - in < trailing) {
	    break;
	}

	for ( ; trailing; trailing--) {
	    if (in >= inend)
		break;
	    if (((d= *in++) & 0xC0) != 0x80) {
		*outlen = out - outstart;
		*inlen = processed - instart;
		return(-2);
	    }
	    c <<= 6;
	    c |= d & 0x3F;
	}

	/* assertion: c is a single UTF-4 value */
	if (c <= 0xFF) {
	    if (out >= outend)
		break;
	    *out++ = c;
	} else {
	    /* no chance for this in IsoLat1 */
	    *outlen = out - outstart;
	    *inlen = processed - instart;
	    return(-2);
	}
	processed = in;
    }
    *outlen = out - outstart;
    *inlen = processed - instart;
    return(*outlen);
}